

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

Phdr ** endofsecdef(GlobalVars *gv,LinkedSection *ls)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  MemoryDescr *pMVar9;
  Phdr *pPVar10;
  long in_RSI;
  long in_RDI;
  lword val;
  char *buf;
  char c;
  int err;
  int done;
  int phdrcnt;
  MemoryDescr *md;
  Phdr *phdr;
  Phdr **pp;
  char *fn;
  MemoryDescr *in_stack_ffffffffffffff78;
  MemoryDescr *in_stack_ffffffffffffff80;
  lword *in_stack_ffffffffffffff88;
  GlobalVars *in_stack_ffffffffffffff90;
  undefined2 local_50;
  int local_34;
  Phdr **local_20;
  
  local_20 = (Phdr **)alloc((size_t)in_stack_ffffffffffffff80);
  local_34 = 0;
  bVar1 = false;
  bVar2 = false;
  endofblock((char)((ulong)in_stack_ffffffffffffff80 >> 0x18),
             (char)((ulong)in_stack_ffffffffffffff80 >> 0x10));
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              if (bVar1) {
                if (bVar2) {
                  free(local_20);
                  local_20 = (Phdr **)0x0;
                }
                else {
                  local_20[local_34] = (Phdr *)0x0;
                }
                return local_20;
              }
              cVar4 = getchr();
              if (cVar4 != '\0') break;
              bVar1 = true;
            }
            if (cVar4 != ':') break;
            pcVar8 = getword();
            if (pcVar8 == (char *)0x0) {
              in_stack_ffffffffffffff80 = (MemoryDescr *)scriptname;
              uVar6 = getlineno();
              error(0x4e,in_stack_ffffffffffffff80,(ulong)uVar6);
            }
            else {
              pPVar10 = find_phdr(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                                  in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
              if (pPVar10 == (Phdr *)0x0) {
                in_stack_ffffffffffffff88 = (lword *)scriptname;
                uVar6 = getlineno();
                error(0x6f,in_stack_ffffffffffffff88,(ulong)uVar6,pcVar8);
                bVar2 = true;
              }
              else {
                iVar7 = local_34 + 1;
                local_20[local_34] = pPVar10;
                local_34 = iVar7;
                if (0x3f < iVar7) {
                  ierror("%sphdrcnt overrun","endofsecdef(): ");
                }
              }
            }
          }
          if (cVar4 != '=') break;
          iVar7 = parse_expr((lword)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          if (iVar7 == 0) {
            in_stack_ffffffffffffff78 = (MemoryDescr *)scriptname;
            uVar6 = getlineno();
            error(0x43,in_stack_ffffffffffffff78,(ulong)uVar6);
            bVar2 = true;
          }
          else {
            *(undefined2 *)(in_RDI + 0x218) = local_50;
          }
        }
        if ((cVar4 == '>') || (cVar4 == '@' || cVar4 == 'A')) break;
        bVar1 = true;
        back(1);
      }
      if (cVar4 == 'A') break;
LAB_0011b170:
      pcVar8 = getword();
      if (pcVar8 == (char *)0x0) {
        in_stack_ffffffffffffff90 = (GlobalVars *)scriptname;
        uVar6 = getlineno();
        error(0x4e,in_stack_ffffffffffffff90,(ulong)uVar6);
        bVar2 = true;
      }
      else {
        pMVar9 = find_memblock((char *)in_stack_ffffffffffffff78);
        pcVar3 = scriptname;
        if (pMVar9 == (MemoryDescr *)0x0) {
          uVar6 = getlineno();
          error(0x46,pcVar3,(ulong)uVar6,pcVar8);
          bVar2 = true;
        }
        else if (cVar4 == '>') {
          if ((in_RSI != 0) &&
             (*(MemoryDescr **)(in_RSI + 0x38) = pMVar9, vdefmem = pMVar9,
             *(long *)(in_RSI + 0x30) == 0)) {
            *(MemoryDescr **)(in_RSI + 0x30) = pMVar9;
            ldefmem = pMVar9;
          }
        }
        else if (in_RSI != 0) {
          *(MemoryDescr **)(in_RSI + 0x30) = pMVar9;
          ldefmem = pMVar9;
        }
      }
    }
    cVar5 = getchr();
    if (cVar5 == 'T') {
      cVar5 = getchr();
      if (cVar5 != '>') {
        back(1);
        pcVar8 = scriptname;
        uVar6 = getlineno();
        error(0x42,pcVar8,(ulong)uVar6,0x3e);
      }
      goto LAB_0011b170;
    }
    back(2);
    bVar1 = true;
  } while( true );
}

Assistant:

static struct Phdr **endofsecdef(struct GlobalVars *gv,
                                 struct LinkedSection *ls)
/* Parses syntax of everything which follows the '}' of a section
   definition. Memory-region pointers and fill-value will be initialized
   when the section-pointer 'ls' is given.
   On success the function returns a list of pointers to Phdr structures
   which were defined (terminated by a NULL pointer). This list must
   be deallocated by the caller!
   Syntax: } [>memregion] [AT>lma-region] [:phdr ...] [=fill] */
{
  const char *fn = "endofsecdef(): ";
  struct Phdr **pp = alloc(64 * sizeof(struct Phdr *));  /* it's ugly! */
  struct Phdr *phdr;
  struct MemoryDescr *md;
  int phdrcnt=0,done=0,err=0;
  char c,*buf;
  lword val;

  endofblock('{','}');

  while (!done) {
    switch (c = getchr()) {
      case '>':
      case '@':
      case 'A':
        if (c == 'A') {
          if (getchr() == 'T') {
            if (getchr() != '>') {
              back(1);
              error(66,scriptname,getlineno(),'>');  /* '>' expected */
            }
          }
          else {
            /* it's not AT, but maybe an ASSERT keyword, so get out */
            back(2);
            done = 1;
            break;
          }
        }
        if (buf = getword()) {
          if (md = find_memblock(buf)) {
            if (c == '>') {
              if (ls) {
                ls->relocmem = md;
                vdefmem = md;
                if (ls->destmem == NULL) {
                  ls->destmem = md;
                  ldefmem = md;
                }
              }
            }
            else if (ls) {
              ls->destmem = md;
              ldefmem = md;
            }
          }
          else {
            error(70,scriptname,getlineno(),buf);  /* Unknown memory region */
            err = 1;
          }
        }
        else {
          error(78,scriptname,getlineno());   /* missing argument */
          err = 1;
        }
        break;

      case ':':
        if (buf = getword()) {
          if (phdr = find_phdr(gv,buf,NULL,NULL)) {
            pp[phdrcnt++] = phdr;
            if (phdrcnt >= 64)
              ierror("%sphdrcnt overrun",fn);
          }
          else {
            error(111,scriptname,getlineno(),buf);  /* unknown PHDR */
            err = 1;
          }
        }
        else
          error(78,scriptname,getlineno());
        break;

      case '=':
        if (parse_expr(-1,&val)) {
          gv->filldata = (uint16_t)(val & 0xffff);
        }
        else {
          error(67,scriptname,getlineno());  /* Absolute number expected */
          err = 1;
        }
        break;

      case '\0':
        done = 1;
        break;

      default:
        done = 1;
        back(1);
        break;
    }
  }

  if (err) {
    free(pp);
    pp = NULL;
  }
  else
    pp[phdrcnt] = NULL;

  return pp;
}